

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O3

uLong cm_zlib_crc32_combine_op(uLong crc1,uLong crc2,uLong op)

{
  ulong uVar1;
  z_crc_t p;
  z_crc_t m;
  uint uVar2;
  ulong uVar3;
  
  p = 0;
  uVar2 = 0x80000000;
  while (((uVar2 & (uint)op) == 0 || (p = p ^ (uint)crc1, (uVar2 - 1 & (uint)op) != 0))) {
    uVar2 = uVar2 >> 1;
    uVar3 = crc1 >> 1 & 0x7fffffff;
    uVar1 = crc1 & 1;
    crc1 = (ulong)((uint)uVar3 ^ 0xedb88320);
    if (uVar1 == 0) {
      crc1 = uVar3;
    }
  }
  return p ^ crc2;
}

Assistant:

uLong crc32_combine_op(crc1, crc2, op)
    uLong crc1;
    uLong crc2;
    uLong op;
{
    return multmodp(op, crc1) ^ crc2;
}